

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumeReliablePdu.cpp
# Opt level: O0

int __thiscall DIS::StartResumeReliablePdu::getMarshalledSize(StartResumeReliablePdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int marshalSize;
  StartResumeReliablePdu *this_local;
  
  iVar1 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar2 = ClockTime::getMarshalledSize(&this->_realWorldTime);
  iVar3 = ClockTime::getMarshalledSize(&this->_simulationTime);
  return iVar1 + iVar2 + iVar3 + 8;
}

Assistant:

int StartResumeReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _realWorldTime.getMarshalledSize();  // _realWorldTime
   marshalSize = marshalSize + _simulationTime.getMarshalledSize();  // _simulationTime
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 4;  // _requestID
    return marshalSize;
}